

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args_test.cpp
# Opt level: O2

void __thiscall Args_Normalization_Test::~Args_Normalization_Test(Args_Normalization_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Args, Normalization) {
    auto expectNoError = [](const std::string &s) { ASSERT_FALSE(true); };

    {
        int nthreads = 0;
        auto argv = makeArgs("--n_threads 4");
        EXPECT_TRUE(ParseArg(&argv, "nthreads", &nthreads, expectNoError));
        EXPECT_EQ(nthreads, 4);
        EXPECT_TRUE(*argv == nullptr);
    }
    {
        int nthreads = 0;
        auto argv = makeArgs("--nThreads=4");
        EXPECT_TRUE(ParseArg(&argv, "nthreads", &nthreads, expectNoError));
        EXPECT_EQ(nthreads, 4);
        EXPECT_TRUE(*argv == nullptr);
    }
}